

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

permonst * rndmonst(level *lev)

{
  d_level *dlev;
  long lVar1;
  char cVar2;
  ushort uVar3;
  mon_gen_override *pmVar4;
  mon_gen_tuple *pmVar5;
  bool bVar6;
  uint uVar7;
  boolean bVar8;
  xchar xVar9;
  boolean bVar10;
  byte bVar11;
  uint uVar12;
  permonst *ppVar13;
  ushort **ppuVar14;
  s_level *psVar15;
  d_flags *pdVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  mon_gen_tuple *pmVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  
  dlev = &lev->z;
  if (lev->mon_gen != (mon_gen_override *)0x0) {
    uVar12 = mt_random();
    pmVar4 = lev->mon_gen;
    if ((int)(uVar12 % 100) < pmVar4->override_chance) {
      iVar18 = pmVar4->total_mon_freq;
      uVar12 = mt_random();
      iVar18 = SUB164(ZEXT416(uVar12) % SEXT816((long)iVar18),0) + 1;
      pmVar5 = pmVar4->gen_chances;
      uVar12 = 100;
      do {
        pmVar21 = pmVar5;
        bVar24 = pmVar5 != (mon_gen_tuple *)0x0;
        if ((pmVar5 != (mon_gen_tuple *)0x0) &&
           (iVar19 = iVar18 - pmVar5->freq, bVar6 = pmVar5->freq <= iVar18, iVar18 = iVar19,
           iVar19 != 0 && bVar6)) {
          do {
            pmVar21 = pmVar21->next;
            bVar24 = pmVar21 != (mon_gen_tuple *)0x0;
            iVar18 = iVar19;
            if (pmVar21 == (mon_gen_tuple *)0x0) break;
            iVar18 = iVar19 - pmVar21->freq;
            bVar6 = pmVar21->freq <= iVar19;
            iVar19 = iVar18;
          } while (iVar18 != 0 && bVar6);
        }
        if ((bVar24) && (iVar18 < 1)) {
          iVar19 = pmVar21->monid;
          if (pmVar21->is_sym != '\0') {
            ppVar13 = mkclass(dlev,(char)iVar19,0);
            goto LAB_001bd54e;
          }
          if ((mvitals[iVar19].mvflags & 2) == 0) {
            ppVar13 = mons + iVar19;
            goto LAB_001bd54e;
          }
        }
        bVar24 = 1 < uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar24);
      ppVar13 = (permonst *)0x0;
LAB_001bd54e:
      if (ppVar13 != (permonst *)0x0) {
        return ppVar13;
      }
    }
  }
  if (rndmonst_state.choice_count < 0) {
    rndmonst_state.choice_count = 0;
    uVar23 = 0;
    do {
      bVar8 = uncommon(dlev,(int)uVar23);
      if (bVar8 == '\0') goto LAB_001bd60c;
      rndmonst_state.mchoices[uVar23] = '\0';
      uVar23 = uVar23 + 1;
    } while (uVar23 != 0x158);
    uVar23 = 0x158;
LAB_001bd60c:
    uVar12 = (uint)uVar23;
    if (uVar12 == 0x158) {
      return (permonst *)0x0;
    }
    xVar9 = level_difficulty(dlev);
    uVar7 = (uint)u.uevent >> 0xd;
    iVar18 = max_monster_difficulty(dlev);
    bVar8 = on_level(dlev,&dungeon_topology.d_rogue_level);
    bVar24 = true;
    if (dlev->dnum == dungeon_topology.d_astral_level.dnum) {
      bVar10 = on_level(dlev,&dungeon_topology.d_astral_level);
      bVar24 = bVar10 != '\0';
    }
    if (uVar12 < 0x158) {
      uVar23 = uVar23 & 0xffffffff;
      ppVar13 = mons + uVar23;
      lVar22 = 0;
      do {
        *(undefined1 *)(uVar23 + 0x32eae8 + lVar22) = 0;
        if ((((int)xVar9 / (int)((uint)((uVar7 & 1) == 0) * 2 + 4) <= monstr[uVar23 + lVar22]) &&
            (monstr[uVar23 + lVar22] <= iVar18)) &&
           ((bVar8 == '\0' ||
            (ppuVar14 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar14 + (ulong)(byte)""[ppVar13->mlet] * 2 + 1) & 1) != 0)))) {
          if (!bVar24) {
            cVar2 = ppVar13->mlet;
            if (cVar2 == '\x1f') {
              bVar11 = is_home_elemental(dlev,ppVar13);
            }
            else {
              bVar10 = on_level(dlev,&dungeon_topology.d_earth_level);
              if (bVar10 != '\0') goto LAB_001bd771;
              bVar10 = on_level(dlev,&dungeon_topology.d_water_level);
              if (bVar10 == '\0') {
                bVar10 = on_level(dlev,&dungeon_topology.d_fire_level);
                if (bVar10 == '\0') {
                  bVar10 = on_level(dlev,&dungeon_topology.d_air_level);
                  if (((((bVar10 != '\0') && (cVar2 != '\x05')) &&
                       ((cVar2 != '\x14' & (byte)ppVar13->mflags1) == 0)) &&
                      ((cVar2 != '6' && (char)((ppVar13->mflags1 & 4) >> 2) == '\0' &&
                       (uVar23 + lVar22 != 0x9f)))) && (cVar2 != '\x16')) goto LAB_001bd8b0;
                  goto LAB_001bd771;
                }
                bVar11 = ppVar13->mresists & 1;
              }
              else {
                bVar11 = (byte)ppVar13->mflags1 & 2;
              }
            }
            if (bVar11 == 0) goto LAB_001bd8b0;
          }
LAB_001bd771:
          bVar10 = uncommon(dlev,uVar12 + (int)lVar22);
          if (((bVar10 == '\0') &&
              ((bVar10 = In_hell(dlev), bVar10 == '\0' || ((ppVar13->geno & 0x800) == 0)))) &&
             (((ppVar13->mflags2 & 0x400000) == 0 ||
              (bVar10 = on_level(dlev,&dungeon_topology.d_blackmarket_level), bVar10 == '\0')))) {
            uVar3 = ppVar13->geno;
            psVar15 = Is_special(dlev);
            if (psVar15 == (s_level *)0x0) {
              pdVar16 = &dungeons[dlev->dnum].flags;
            }
            else {
              pdVar16 = &psVar15->flags;
            }
            uVar17 = (uint)*pdVar16 >> 4 & 7;
            if (uVar17 == 1) {
              iVar20 = 0x14 - ppVar13->maligntyp;
              iVar19 = 0x1b - ppVar13->maligntyp;
              if (-1 < iVar20) {
                iVar19 = iVar20;
              }
LAB_001bd883:
              iVar19 = iVar19 >> 3;
            }
            else if (uVar17 == 2) {
              bVar11 = ppVar13->maligntyp >> 7;
              uVar17 = (uint)(byte)((ppVar13->maligntyp ^ bVar11) - bVar11);
              iVar20 = 0x14 - uVar17;
              iVar19 = 0x17 - uVar17;
              if (-1 < iVar20) {
                iVar19 = iVar20;
              }
              iVar19 = iVar19 >> 2;
            }
            else {
              iVar19 = 0;
              if (uVar17 == 4) {
                iVar20 = ppVar13->maligntyp + 0x14;
                iVar19 = ppVar13->maligntyp + 0x1b;
                if (-1 < iVar20) {
                  iVar19 = iVar20;
                }
                goto LAB_001bd883;
              }
            }
            uVar17 = (uVar3 & 7) + iVar19;
            if ((int)uVar17 < 0) {
              panic("rndmonst: bad count [#%d: %d]",(ulong)(uVar12 + (int)lVar22),(ulong)uVar17);
            }
            rndmonst_state.choice_count = rndmonst_state.choice_count + uVar17;
            *(char *)(uVar23 + 0x32eae8 + lVar22) = (char)uVar17;
          }
        }
LAB_001bd8b0:
        ppVar13 = ppVar13 + 1;
        lVar1 = uVar23 + lVar22;
        lVar22 = lVar22 + 1;
      } while (lVar1 != 0x157);
    }
  }
  iVar18 = rndmonst_state.choice_count;
  if (rndmonst_state.choice_count < 1) {
    return (permonst *)0x0;
  }
  uVar12 = mt_random();
  uVar23 = 0;
  iVar18 = uVar12 % (uint)iVar18 + 1;
  do {
    iVar19 = iVar18 - rndmonst_state.mchoices[uVar23];
    if (iVar19 == 0 || iVar18 < rndmonst_state.mchoices[uVar23]) goto LAB_001bd59f;
    uVar23 = uVar23 + 1;
    iVar18 = iVar19;
  } while (uVar23 != 0x158);
  uVar23 = 0x158;
LAB_001bd59f:
  if (((int)uVar23 != 0x158) && (bVar8 = uncommon(dlev,(int)uVar23), bVar8 == '\0')) {
    return mons + (uVar23 & 0xffffffff);
  }
  warning("rndmonst: bad `mndx\' [#%d]",uVar23 & 0xffffffff);
  return (permonst *)0x0;
}

Assistant:

const struct permonst *rndmonst(struct level *lev)
{
	const struct permonst *ptr;
	int mndx, ct;
	const d_level *dlev = &lev->z;

	if (lev->mon_gen &&
	    rn2(100) < lev->mon_gen->override_chance &&
	    (ptr = get_override_mon(&lev->z, lev->mon_gen)) != NULL)
	    return ptr;

	if (rndmonst_state.choice_count < 0) {	/* need to recalculate */
	    int minmlev, maxmlev;
	    boolean elemlevel;
	    boolean upper;

	    rndmonst_state.choice_count = 0;
	    /* look for first common monster */
	    for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++) {
		if (!uncommon(dlev, mndx)) break;
		rndmonst_state.mchoices[mndx] = 0;
	    }		
	    if (mndx == SPECIAL_PM) {
		/* evidently they've all been exterminated */
		return NULL;
	    } /* else `mndx' now ready for use below */
	    minmlev = min_monster_difficulty(dlev);
	    maxmlev = max_monster_difficulty(dlev);
	    upper = Is_rogue_level(dlev);
	    elemlevel = In_endgame(dlev) && !Is_astralevel(dlev);

/*
 *	Find out how many monsters exist in the range we have selected.
 */
	    /* (`mndx' initialized above) */
	    for ( ; mndx < SPECIAL_PM; mndx++) {
		ptr = &mons[mndx];
		rndmonst_state.mchoices[mndx] = 0;
		if (tooweak(mndx, minmlev) || toostrong(mndx, maxmlev))
		    continue;
		if (upper && !isupper((uchar)def_monsyms[(int)(ptr->mlet)])) continue;
		if (elemlevel && wrong_elem_type(dlev, ptr)) continue;
		if (uncommon(dlev, mndx)) continue;
		if (In_hell(dlev) && (ptr->geno & G_NOHELL)) continue;
		/* SWD: pets are not allowed in the black market */
		if (is_domestic(ptr) && Is_blackmarket(dlev)) continue;
		ct = (int)(ptr->geno & G_FREQ) + align_shift(dlev, ptr);
		if (ct < 0 || ct > 127)
		    panic("rndmonst: bad count [#%d: %d]", mndx, ct);
		rndmonst_state.choice_count += ct;
		rndmonst_state.mchoices[mndx] = (char)ct;
	    }
/*
 *	    Possible modification:  if choice_count is "too low",
 *	    expand minmlev..maxmlev range and try again.
 */
	} /* choice_count+mchoices[] recalc */

	if (rndmonst_state.choice_count <= 0) {
	    /* maybe no common mons left, or all are too weak or too strong */
	    return NULL;
	}

/*
 *	Now, select a monster at random.
 */
	ct = rnd(rndmonst_state.choice_count);
	for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++)
	    if ((ct -= (int)rndmonst_state.mchoices[mndx]) <= 0) break;

	if (mndx == SPECIAL_PM || uncommon(dlev, mndx)) {	/* shouldn't happen */
	    warning("rndmonst: bad `mndx' [#%d]", mndx);
	    return NULL;
	}
	return &mons[mndx];
}